

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_search_start(bitstream *str)

{
  int iVar1;
  int iVar2;
  int *in_RDI;
  int bit;
  int nzbit;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (*in_RDI == 1) {
    if ((in_RDI[0xb] == 0) || (in_RDI[0xb] == 2)) {
      iVar1 = 0x10;
      if (in_RDI[0xb] == 0) {
        iVar1 = 0xf;
      }
      do {
        if ((in_RDI[0xc] == 0) && (in_RDI[4] <= in_RDI[8])) {
          return 0;
        }
        if (iVar1 <= in_RDI[10]) {
          return 1;
        }
        iVar2 = vs_bit((bitstream *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),(uint32_t *)0x102980);
      } while (iVar2 == 0);
      local_4 = 0;
    }
    else {
      in_RDI[0xc] = 0;
      in_RDI[7] = 7;
      while (in_RDI[8] < in_RDI[4]) {
        if ((in_RDI[9] == 2) && (*(char *)(*(long *)(in_RDI + 2) + (long)in_RDI[8]) == '\x01')) {
          return 1;
        }
        if (*(char *)(*(long *)(in_RDI + 2) + (long)in_RDI[8]) == '\0') {
          if (in_RDI[9] != 2) {
            in_RDI[9] = in_RDI[9] + 1;
          }
        }
        else {
          in_RDI[9] = 0;
        }
        in_RDI[8] = in_RDI[8] + 1;
      }
      local_4 = 0;
    }
  }
  else {
    fprintf(_stderr,"vs_search_start called in encode mode!\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int vs_search_start(struct bitstream *str) {
	if (str->dir != VS_DECODE) {
		fprintf (stderr, "vs_search_start called in encode mode!\n");
		return -1;
	}
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		while (1) {
			int bit;
			if (!str->hasbyte && str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bits >= nzbit)
				return 1;
			if (vs_bit(str, &bit)) return 0;
		}
	} else {
		str->hasbyte = 0;
		str->bitpos = 7;
		while (1) {
			if (str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bytes == 2 && str->bytes[str->bytepos] == 1)
				return 1;
			if (str->bytes[str->bytepos] == 0) {
				if (str->zero_bytes != 2)
					str->zero_bytes++;
			} else {
				str->zero_bytes = 0;
			}
			str->bytepos++;
		}
	}
}